

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_send.c
# Opt level: O2

void ares_send(ares_channel_t *channel,uchar *qbuf,int qlen,ares_callback callback,void *arg)

{
  ares_status_t aVar1;
  void *arg_00;
  ares_dns_record_t *dnsrec;
  
  dnsrec = (ares_dns_record_t *)0x0;
  if (channel != (ares_channel_t *)0x0) {
    if (qlen - 0x10000U < 0xffff000c) {
      (*callback)(arg,7,0,(uchar *)0x0,0);
      return;
    }
    aVar1 = ares_dns_parse(qbuf,(ulong)(uint)qlen,0,&dnsrec);
    if (aVar1 == ARES_SUCCESS) {
      arg_00 = ares_dnsrec_convert_arg(callback,arg);
      if (arg_00 != (void *)0x0) {
        ares_send_dnsrec(channel,dnsrec,ares_dnsrec_convert_cb,arg_00,(unsigned_short *)0x0);
        ares_dns_record_destroy(dnsrec);
        return;
      }
      ares_dns_record_destroy(dnsrec);
      aVar1 = ARES_ENOMEM;
    }
    (*callback)(arg,aVar1,0,(uchar *)0x0,0);
  }
  return;
}

Assistant:

void ares_send(ares_channel_t *channel, const unsigned char *qbuf, int qlen,
               ares_callback callback, void *arg)
{
  ares_dns_record_t *dnsrec = NULL;
  ares_status_t      status;
  void              *carg = NULL;

  if (channel == NULL) {
    return;
  }

  /* Verify that the query is at least long enough to hold the header. */
  if (qlen < HFIXEDSZ || qlen >= (1 << 16)) {
    callback(arg, ARES_EBADQUERY, 0, NULL, 0);
    return;
  }

  status = ares_dns_parse(qbuf, (size_t)qlen, 0, &dnsrec);
  if (status != ARES_SUCCESS) {
    callback(arg, (int)status, 0, NULL, 0);
    return;
  }

  carg = ares_dnsrec_convert_arg(callback, arg);
  if (carg == NULL) {
    /* LCOV_EXCL_START: OutOfMemory */
    status = ARES_ENOMEM;
    ares_dns_record_destroy(dnsrec);
    callback(arg, (int)status, 0, NULL, 0);
    return;
    /* LCOV_EXCL_STOP */
  }

  ares_send_dnsrec(channel, dnsrec, ares_dnsrec_convert_cb, carg, NULL);

  ares_dns_record_destroy(dnsrec);
}